

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

type_conflict CLI::detail::checked_multiply<int>(int *a,int b)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = *a;
  if ((b != 0 && uVar1 != 0) && (b != 1 && uVar1 != 1)) {
    uVar2 = -uVar1;
    if (0 < (int)uVar1) {
      uVar2 = uVar1;
    }
    if (b < 1 == 0 < (int)uVar1) {
      uVar3 = -b;
      if (b < 1) {
        uVar3 = b;
      }
      if (uVar3 < (uint)-(int)(0x80000000 / (ulong)uVar2)) {
        return false;
      }
    }
    else {
      uVar3 = -b;
      if (0 < b) {
        uVar3 = b;
      }
      if ((uint)(0x7fffffff / (ulong)uVar2) < uVar3) {
        return false;
      }
    }
  }
  *a = uVar1 * b;
  return true;
}

Assistant:

typename std::enable_if<std::is_integral<T>::value, bool>::type checked_multiply(T &a, T b) {
    if(a == 0 || b == 0 || a == 1 || b == 1) {
        a *= b;
        return true;
    }
    if(a == (std::numeric_limits<T>::min)() || b == (std::numeric_limits<T>::min)()) {
        return false;
    }
    if(overflowCheck(a, b)) {
        return false;
    }
    a *= b;
    return true;
}